

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::callNativeMethod
          (StackInterpreter *this,NativeMethod *nativeMethod,size_t argumentCount)

{
  StackMemory *this_00;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  uint8_t *puVar2;
  uintptr_t value;
  Oop OVar3;
  undefined1 local_60 [8];
  StackInterpreterProxy proxy;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  anon_union_8_4_0eb573b0_for_Oop_0 local_30;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  Oop receiver;
  size_t argumentCount_local;
  NativeMethod *nativeMethod_local;
  StackInterpreter *this_local;
  
  receiver.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)argumentCount;
  paVar1 = &stackOopAtOffset(this,(argumentCount + 1) * 8)->field_0;
  local_28 = *paVar1;
  puVar2 = StackMemory::getFramePointer(this->stack);
  pushPointer(this,puVar2);
  this_00 = this->stack;
  puVar2 = StackMemory::getStackPointer(this->stack);
  StackMemory::setFramePointer(this_00,puVar2);
  local_30 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(nativeMethod);
  pushOop(this,(Oop)local_30);
  this->method = (CompiledMethod *)0x0;
  value = encodeFrameMetaData(false,false,(size_t)receiver.field_0);
  pushUInt(this,value);
  Oop::Oop((Oop *)&local_38);
  pushOop(this,(Oop)local_38);
  pushOop(this,(Oop)local_28);
  OVar3 = Oop::fromPointer(nativeMethod);
  pushOop(this,OVar3);
  garbageCollectionSafePoint(this);
  OVar3 = popOop(this);
  proxy.interpreter = (StackInterpreter *)OVar3;
  fetchFrameData(this);
  this->pc = 0;
  this->primitiveHasFailed = false;
  checkStackOverflow(this);
  StackInterpreterProxy::StackInterpreterProxy((StackInterpreterProxy *)local_60,this);
  (**(code **)((long)OVar3.field_0 + 8))(local_60);
  if ((this->primitiveHasFailed & 1U) != 0) {
    this->pc = 0;
    paVar1 = &currentReceiver(this)->field_0;
    pushOop(this,(Oop)*paVar1);
    OVar3 = Oop::encodeSmallInteger((long)this->primitiveErrorCode);
    pushOop(this,OVar3);
    sendSpecialArgumentCount(this,NativeMethodFailed,1);
  }
  return;
}

Assistant:

void StackInterpreter::callNativeMethod(NativeMethod *nativeMethod, size_t argumentCount)
{
    // Get the receiver
	auto receiver = stackOopAtOffset((1 + argumentCount)*sizeof(Oop));

	// Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(nativeMethod));
	this->method = nullptr;

	// Encode frame metadata
	pushUInt(encodeFrameMetaData(false, false, argumentCount));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

    // Safe point for GC.
    pushOop(Oop::fromPointer(nativeMethod));
    garbageCollectionSafePoint();
    nativeMethod = reinterpret_cast<NativeMethod*> (popOop().pointer);

	// Fetch the frame data.
	fetchFrameData();

    // Set the new pc.
    pc = 0;

    // Reset the primitive has failed flag.
    primitiveHasFailed = 0;

    // Check for stack overflow.
    checkStackOverflow();

    // Call the primitive
    StackInterpreterProxy proxy(this);
    nativeMethod->primitive(&proxy);

    // Check for failure of the primtiive.
    if(primitiveHasFailed)
    {
        pc = 0;
        pushOop(currentReceiver());
        pushOop(Oop::encodeSmallInteger(primitiveErrorCode));
        sendSpecialArgumentCount(SpecialMessageSelector::NativeMethodFailed, 1);
    }
}